

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O3

secp256k1_ecdsa_signature *
cfd::core::ParseSignature(secp256k1_ecdsa_signature *__return_storage_ptr__,ByteData *signature)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  string local_48;
  
  ctx = wally_get_secp_context();
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,signature);
  iVar1 = secp256k1_ecdsa_signature_parse_compact
                    (ctx,__return_storage_ptr__,(uchar *)local_48._M_dataplus._M_p);
  if ((uchar *)local_48._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (iVar1 == 1) {
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Could not parse ECDSA signature.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,&local_48);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

secp256k1_ecdsa_signature ParseSignature(const ByteData& signature) {
  auto ctx = wally_get_secp_context();
  secp256k1_ecdsa_signature result;
  auto ret = secp256k1_ecdsa_signature_parse_compact(
      ctx, &result, signature.GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Could not parse ECDSA signature.");
  }

  return result;
}